

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall PSVIWriterHandlers::~PSVIWriterHandlers(PSVIWriterHandlers *this)

{
  ~PSVIWriterHandlers((PSVIWriterHandlers *)&this[-1].fAttributesInfo);
  return;
}

Assistant:

PSVIWriterHandlers::~PSVIWriterHandlers() {
	if (fBaseUri != NULL)
		XMLString::release(&fBaseUri);
	delete fAttrList;
	delete[] fTempResult;
	XMLPlatformUtils::fgMemoryManager->deallocate(fIndentChars);

	delete fIdMap;
	delete fDefinedIds;
	delete fIdNames;
	delete fObjectLocations;

	delete fPrefixMap;
	delete fNamespaces;

	delete fNSAttributes;
	delete fElementChildren;

	delete fAttributesInfo;

}